

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O0

value __thiscall merlin::factor::entropy(factor *this)

{
  uint uVar1;
  double dVar2;
  const_reference pvVar3;
  double L;
  size_t i;
  value Z;
  value H;
  factor *this_local;
  
  Z = 0.0;
  i = 0;
  L = 0.0;
  while( true ) {
    dVar2 = (double)num_states(this);
    if ((ulong)dVar2 <= (ulong)L) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&this->t_,(size_type)L);
    i = (size_t)(*pvVar3 + (double)i);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&this->t_,(size_type)L);
    dVar2 = ::log(*pvVar3);
    uVar1 = std::isinf(dVar2);
    if ((uVar1 & 1) == 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&this->t_,(size_type)L);
      Z = -*pvVar3 * dVar2 + Z;
    }
    L = (double)((long)L + 1);
  }
  dVar2 = ::log((double)i);
  return dVar2 + Z / (double)i;
}

Assistant:

value entropy(void) const {
		value H = 0, Z = 0;
		for (size_t i = 0; i < num_states(); i++) {
			Z += t_[i];
			double L = std::log(t_[i]);
			if (!isinf(L))
				H -= t_[i] * L; //std::log(t_[i]);
		}
		H /= Z;
		H += std::log(Z);
		return H;
	}